

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O1

int rtosc_arg_vals_cmp(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,size_t lsize,size_t rsize,
                      rtosc_cmp_options *opt)

{
  int iVar1;
  uint uVar2;
  rtosc_arg_val_t *_lhs;
  rtosc_arg_val_t *_rhs;
  rtosc_cmp_options *opt_00;
  bool bVar3;
  rtosc_arg_val_itr ritr;
  rtosc_arg_val_itr litr;
  rtosc_arg_val_t rrhs;
  rtosc_arg_val_t rlhs;
  rtosc_arg_val_itr local_90;
  rtosc_arg_val_itr local_78;
  rtosc_arg_val_t local_60;
  rtosc_arg_val_t local_48;
  
  rtosc_arg_val_itr_init(&local_78,lhs);
  rtosc_arg_val_itr_init(&local_90,rhs);
  opt_00 = &default_cmp_options;
  if (opt != (rtosc_cmp_options *)0x0) {
    opt_00 = opt;
  }
  iVar1 = rtosc_arg_vals_cmp_has_next(&local_78,&local_90,lsize,rsize);
  if (iVar1 == 0) {
    bVar3 = true;
    uVar2 = 0;
  }
  else {
    do {
      _lhs = rtosc_arg_val_itr_get(&local_78,&local_48);
      _rhs = rtosc_arg_val_itr_get(&local_90,&local_60);
      uVar2 = rtosc_arg_vals_cmp_single(_lhs,_rhs,opt_00);
      rtosc_arg_val_itr_next(&local_78);
      rtosc_arg_val_itr_next(&local_90);
      iVar1 = rtosc_arg_vals_cmp_has_next(&local_78,&local_90,lsize,rsize);
      bVar3 = uVar2 == 0;
      if (iVar1 == 0) break;
    } while (uVar2 == 0);
  }
  if (bVar3) {
    iVar1 = rtosc_arg_vals_eq_after_abort(&local_78,&local_90,lsize,rsize);
    uVar2 = 0;
    if (iVar1 == 0) {
      uVar2 = (rsize - local_90.i < lsize - local_78.i) - 1 | 1;
    }
  }
  return uVar2;
}

Assistant:

int rtosc_arg_vals_cmp(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                       size_t lsize, size_t rsize,
                       const rtosc_cmp_options* opt)
{
    // used if the value of lhs or rhs is range-computed:
    rtosc_arg_val_t rlhs, rrhs;

    rtosc_arg_val_itr litr, ritr;
    rtosc_arg_val_itr_init(&litr, lhs);
    rtosc_arg_val_itr_init(&ritr, rhs);

    int rval = 0;

    if(!opt)
        opt = &default_cmp_options;

    for( ; rtosc_arg_vals_cmp_has_next(&litr, &ritr, lsize, rsize) && !rval;
        rtosc_arg_val_itr_next(&litr),
        rtosc_arg_val_itr_next(&ritr))
    {
        rval = rtosc_arg_vals_cmp_single(rtosc_arg_val_itr_get(&litr, &rlhs),
                                         rtosc_arg_val_itr_get(&ritr, &rrhs),
                                         opt);
    }

    return rval ? rval
                : (rtosc_arg_vals_eq_after_abort(&litr, &ritr, lsize, rsize))
                    ? 0
                    // they're equal until here, so one array must have
                    // elements left:
                    : (lsize-(litr.i) > rsize-(ritr.i))
                        ? 1
                        : -1;
}